

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O1

void rhash_sha3_process_block(uint64_t *hash,uint64_t *block,size_t block_size)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint64_t C [5];
  ulong local_88 [6];
  ulong local_58 [5];
  
  *hash = *hash ^ *block;
  hash[1] = hash[1] ^ block[1];
  hash[2] = hash[2] ^ block[2];
  hash[3] = hash[3] ^ block[3];
  hash[4] = hash[4] ^ block[4];
  hash[5] = hash[5] ^ block[5];
  hash[6] = hash[6] ^ block[6];
  hash[7] = hash[7] ^ block[7];
  hash[8] = hash[8] ^ block[8];
  if (0x48 < block_size) {
    hash[9] = hash[9] ^ block[9];
    hash[10] = hash[10] ^ block[10];
    hash[0xb] = hash[0xb] ^ block[0xb];
    hash[0xc] = hash[0xc] ^ block[0xc];
    if (0x68 < block_size) {
      hash[0xd] = hash[0xd] ^ block[0xd];
      hash[0xe] = hash[0xe] ^ block[0xe];
      hash[0xf] = hash[0xf] ^ block[0xf];
      hash[0x10] = hash[0x10] ^ block[0x10];
      if (0x88 < block_size) {
        hash[0x11] = hash[0x11] ^ block[0x11];
      }
    }
  }
  lVar15 = 0;
  do {
    lVar1 = 0;
    do {
      local_58[lVar1] =
           hash[lVar1 + 5] ^ hash[lVar1] ^ hash[lVar1 + 10] ^ hash[lVar1 + 0xf] ^ hash[lVar1 + 0x14]
      ;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 5);
    local_88[0] = (local_58[1] << 1 | (ulong)((long)local_58[1] < 0)) ^ local_58[4];
    local_88[1] = (local_58[2] << 1 | (ulong)((long)local_58[2] < 0)) ^ local_58[0];
    local_88[2] = (local_58[3] << 1 | (ulong)((long)local_58[3] < 0)) ^ local_58[1];
    local_88[3] = (local_58[4] << 1 | (ulong)((long)local_58[4] < 0)) ^ local_58[2];
    local_88[4] = (local_58[0] << 1 | (ulong)((long)local_58[0] < 0)) ^ local_58[3];
    lVar1 = 0;
    do {
      uVar2 = local_88[lVar1];
      hash[lVar1] = hash[lVar1] ^ uVar2;
      hash[lVar1 + 5] = hash[lVar1 + 5] ^ uVar2;
      hash[lVar1 + 10] = hash[lVar1 + 10] ^ uVar2;
      hash[lVar1 + 0xf] = hash[lVar1 + 0xf] ^ uVar2;
      hash[lVar1 + 0x14] = hash[lVar1 + 0x14] ^ uVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 5);
    uVar2 = hash[1] << 1 | (ulong)((long)hash[1] < 0);
    hash[1] = uVar2;
    uVar13 = hash[2] << 0x3e | hash[2] >> 2;
    hash[2] = uVar13;
    uVar3 = hash[3] << 0x1c | hash[3] >> 0x24;
    hash[3] = uVar3;
    uVar4 = hash[4] << 0x1b | hash[4] >> 0x25;
    hash[4] = uVar4;
    uVar5 = hash[5] << 0x24 | hash[5] >> 0x1c;
    hash[5] = uVar5;
    uVar6 = hash[6] << 0x2c | hash[6] >> 0x14;
    hash[6] = uVar6;
    uVar7 = hash[7] << 6 | hash[7] >> 0x3a;
    hash[7] = uVar7;
    uVar8 = hash[8] << 0x37 | hash[8] >> 9;
    hash[8] = uVar8;
    uVar9 = hash[9] << 0x14 | hash[9] >> 0x2c;
    hash[9] = uVar9;
    uVar10 = hash[10] << 3 | hash[10] >> 0x3d;
    hash[10] = uVar10;
    uVar11 = hash[0xb] << 10 | hash[0xb] >> 0x36;
    hash[0xb] = uVar11;
    uVar18 = hash[0xc] << 0x2b | hash[0xc] >> 0x15;
    hash[0xc] = uVar18;
    uVar24 = hash[0xd] << 0x19 | hash[0xd] >> 0x27;
    hash[0xd] = uVar24;
    uVar23 = hash[0xe] << 0x27 | hash[0xe] >> 0x19;
    hash[0xe] = uVar23;
    uVar17 = hash[0xf] << 0x29 | hash[0xf] >> 0x17;
    hash[0xf] = uVar17;
    uVar26 = hash[0x10] << 0x2d | hash[0x10] >> 0x13;
    hash[0x10] = uVar26;
    uVar25 = hash[0x11] << 0xf | hash[0x11] >> 0x31;
    hash[0x11] = uVar25;
    uVar22 = hash[0x12] << 0x15 | hash[0x12] >> 0x2b;
    hash[0x12] = uVar22;
    uVar21 = hash[0x13] << 8 | hash[0x13] >> 0x38;
    hash[0x13] = uVar21;
    uVar19 = hash[0x14] << 0x12 | hash[0x14] >> 0x2e;
    hash[0x14] = uVar19;
    uVar20 = hash[0x15] << 2 | hash[0x15] >> 0x3e;
    hash[0x15] = uVar20;
    uVar12 = hash[0x16] << 0x3d | hash[0x16] >> 3;
    hash[0x16] = uVar12;
    uVar16 = hash[0x17] << 0x38 | hash[0x17] >> 8;
    hash[0x17] = uVar16;
    uVar14 = hash[0x18] << 0xe | hash[0x18] >> 0x32;
    hash[0x18] = uVar14;
    hash[1] = uVar6;
    hash[6] = uVar9;
    hash[9] = uVar12;
    hash[0x16] = uVar23;
    hash[0xe] = uVar19;
    hash[0x14] = uVar13;
    hash[2] = uVar18;
    hash[0xc] = uVar24;
    hash[0xd] = uVar21;
    hash[0x13] = uVar16;
    hash[0x17] = uVar17;
    hash[0xf] = uVar4;
    hash[4] = uVar14;
    hash[0x18] = uVar20;
    hash[0x15] = uVar8;
    hash[8] = uVar26;
    hash[0x10] = uVar5;
    hash[5] = uVar3;
    hash[3] = uVar22;
    hash[0x12] = uVar25;
    hash[0x11] = uVar11;
    hash[0xb] = uVar7;
    hash[7] = uVar10;
    hash[10] = uVar2;
    uVar2 = 0xfffffffffffffffb;
    do {
      uVar3 = hash[uVar2 + 5];
      uVar4 = hash[uVar2 + 6];
      uVar5 = hash[uVar2 + 7];
      hash[uVar2 + 5] = ~uVar4 & uVar5 ^ uVar3;
      uVar6 = hash[uVar2 + 8];
      hash[uVar2 + 6] = ~uVar5 & uVar6 ^ uVar4;
      uVar7 = hash[uVar2 + 9];
      hash[uVar2 + 7] = ~uVar6 & uVar7 ^ uVar5;
      hash[uVar2 + 8] = ~uVar7 & uVar3 ^ uVar6;
      hash[uVar2 + 9] = ~uVar3 & uVar4 ^ uVar7;
      uVar2 = uVar2 + 5;
    } while (uVar2 < 0x14);
    *hash = *hash ^ keccak_round_constants[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x18);
  return;
}

Assistant:

static void rhash_sha3_process_block(uint64_t hash[25], const uint64_t *block, size_t block_size)
{
	/* expanded loop */
	hash[ 0] ^= le2me_64(block[ 0]);
	hash[ 1] ^= le2me_64(block[ 1]);
	hash[ 2] ^= le2me_64(block[ 2]);
	hash[ 3] ^= le2me_64(block[ 3]);
	hash[ 4] ^= le2me_64(block[ 4]);
	hash[ 5] ^= le2me_64(block[ 5]);
	hash[ 6] ^= le2me_64(block[ 6]);
	hash[ 7] ^= le2me_64(block[ 7]);
	hash[ 8] ^= le2me_64(block[ 8]);
	/* if not sha3-512 */
	if (block_size > 72) {
		hash[ 9] ^= le2me_64(block[ 9]);
		hash[10] ^= le2me_64(block[10]);
		hash[11] ^= le2me_64(block[11]);
		hash[12] ^= le2me_64(block[12]);
		/* if not sha3-384 */
		if (block_size > 104) {
			hash[13] ^= le2me_64(block[13]);
			hash[14] ^= le2me_64(block[14]);
			hash[15] ^= le2me_64(block[15]);
			hash[16] ^= le2me_64(block[16]);
			/* if not sha3-256 */
			if (block_size > 136) {
				hash[17] ^= le2me_64(block[17]);
#ifdef FULL_SHA3_FAMILY_SUPPORT
				/* if not sha3-224 */
				if (block_size > 144) {
					hash[18] ^= le2me_64(block[18]);
					hash[19] ^= le2me_64(block[19]);
					hash[20] ^= le2me_64(block[20]);
					hash[21] ^= le2me_64(block[21]);
					hash[22] ^= le2me_64(block[22]);
					hash[23] ^= le2me_64(block[23]);
					hash[24] ^= le2me_64(block[24]);
				}
#endif
			}
		}
	}
	/* make a permutation of the hash */
	rhash_sha3_permutation(hash);
}